

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op-vec.c
# Opt level: O2

void tcg_gen_cmp_vec_tricore
               (TCGContext_conflict9 *tcg_ctx,TCGCond cond,uint vece,TCGv_vec r,TCGv_vec a,
               TCGv_vec b)

{
  byte bVar1;
  int iVar2;
  uintptr_t o_2;
  uintptr_t o_1;
  
  bVar1 = ((undefined1 *)((long)&tcg_ctx->pool_cur + 2))[(long)r];
  iVar2 = tcg_can_emit_vec_op_tricore(tcg_ctx,INDEX_op_cmp_vec,(uint)bVar1,vece);
  if (iVar2 < 1) {
    tcg_expand_vec_op_tricore
              (tcg_ctx,INDEX_op_cmp_vec,(uint)bVar1,vece,(TCGArg)(r + (long)&tcg_ctx->pool_cur),
               a + (long)tcg_ctx,b + (long)tcg_ctx,(ulong)cond);
  }
  else {
    vec_gen_4_tricore(tcg_ctx,INDEX_op_cmp_vec,(uint)bVar1,vece,
                      (TCGArg)(r + (long)&tcg_ctx->pool_cur),(TCGArg)(a + (long)tcg_ctx),
                      (TCGArg)(b + (long)tcg_ctx),(ulong)cond);
  }
  return;
}

Assistant:

void tcg_gen_cmp_vec(TCGContext *tcg_ctx, TCGCond cond, unsigned vece,
                     TCGv_vec r, TCGv_vec a, TCGv_vec b)
{
    TCGTemp *rt = tcgv_vec_temp(tcg_ctx, r);
    TCGTemp *at = tcgv_vec_temp(tcg_ctx, a);
    TCGTemp *bt = tcgv_vec_temp(tcg_ctx, b);
    TCGArg ri = temp_arg(rt);
    TCGArg ai = temp_arg(at);
    TCGArg bi = temp_arg(bt);
    TCGType type = rt->base_type;
    int can;

    tcg_debug_assert(at->base_type >= type);
    tcg_debug_assert(bt->base_type >= type);
    tcg_assert_listed_vecop(INDEX_op_cmp_vec);
    can = tcg_can_emit_vec_op(tcg_ctx, INDEX_op_cmp_vec, type, vece);
    if (can > 0) {
        vec_gen_4(tcg_ctx, INDEX_op_cmp_vec, type, vece, ri, ai, bi, cond);
    } else {
        const TCGOpcode *hold_list = tcg_swap_vecop_list(NULL);
        tcg_debug_assert(can < 0);
        tcg_expand_vec_op(tcg_ctx, INDEX_op_cmp_vec, type, vece, ri, ai, bi, cond);
        tcg_swap_vecop_list(hold_list);
    }
}